

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  element_type *peVar1;
  pointer pbVar2;
  pointer ppVar3;
  pointer *ppbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  const_reference pvVar9;
  App *this_00;
  Option *this_01;
  Option *pOVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  int64_t iVar11;
  int *piVar12;
  InvalidError *this_02;
  ConfigError *__return_storage_ptr__;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  string *option_name;
  string *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  pointer pbVar14;
  pointer ppVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2b8;
  allocator local_2a9;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&item->parents,level);
    ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar9);
    this_00 = get_subcommand_no_throw(this,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (this_00 == (App *)0x0) {
      return false;
    }
    bVar6 = _parse_single_config(this_00,item,level + 1);
    return bVar6;
  }
  psVar13 = &item->name;
  bVar6 = ::std::operator==(psVar13,"++");
  if (bVar6) {
    if (this->configurable_ != true) {
      return true;
    }
    increment_parsed(this);
    _trigger_pre_parse(this,2);
    if (this->parent_ != (App *)0x0) {
      res._M_dataplus._M_p = (pointer)this;
      ::std::vector<CLI::App*,std::allocator<CLI::App*>>::emplace_back<CLI::App*>
                ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parent_->parsed_subcommands_,
                 (App **)&res);
      return true;
    }
    return true;
  }
  bVar6 = ::std::operator==(psVar13,"--");
  if (bVar6) {
    if (this->configurable_ != true) {
      return true;
    }
    if ((this->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      _process_callbacks(this);
      _process_requirements(this);
      run_callback(this,false,false);
      return true;
    }
    return true;
  }
  ::std::operator+(&local_70,"--",psVar13);
  this_01 = get_option_no_throw(this,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  if (this_01 == (Option *)0x0) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_90,"-",psVar13);
      this_01 = get_option_no_throw(this,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (this_01 != (Option *)0x0) {
        if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
          option_name = &local_d0;
          goto LAB_0013dcaa;
        }
        goto LAB_0013dd09;
      }
    }
    ::std::__cxx11::string::string((string *)&local_b0,(string *)psVar13);
    this_01 = get_option_no_throw(this,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    if (this_01 == (Option *)0x0) {
      if (this->allow_config_extras_ != capture) {
        return false;
      }
      local_250._M_dataplus._M_p._0_4_ = 0;
      ConfigItem::fullname_abi_cxx11_(&res,item);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,(Classifier *)&local_250,&res);
      ::std::__cxx11::string::~string((string *)&res);
      pbVar2 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (item->inputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar2;
          pbVar14 = pbVar14 + 1) {
        res._M_dataplus._M_p = res._M_dataplus._M_p & 0xffffffff00000000;
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&this->missing_,(Classifier *)&res,pbVar14);
      }
      return false;
    }
  }
  else if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_f0,"-",psVar13);
      pOVar10 = get_option_no_throw(this,&local_f0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      if ((pOVar10 != (Option *)0x0) &&
         ((pOVar10->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_01 = pOVar10;
      }
    }
    if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
      option_name = &local_110;
LAB_0013dcaa:
      ::std::__cxx11::string::string((string *)option_name,(string *)psVar13);
      pOVar10 = get_option_no_throw(this,option_name);
      ::std::__cxx11::string::~string((string *)option_name);
      if ((pOVar10 != (Option *)0x0) &&
         ((pOVar10->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_01 = pOVar10;
      }
    }
  }
LAB_0013dd09:
  if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
    if (this->allow_config_extras_ == ignore_all) {
      return false;
    }
    __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(&local_170,item);
    ConfigError::NotConfigurable(__return_storage_ptr__,&local_170);
    __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
  }
  if ((this_01->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_01->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((item->multiline == true) && (this_01->inject_separator_ == false)) {
    local_2b8 = &buffer;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_2b8,&item->inputs);
    __first = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )buffer.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )buffer.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_equals_val<const_char[3]>)0x159a04);
    bVar6 = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&buffer,(const_iterator)__first._M_current,
            (const_iterator)
            buffer.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    local_2b8 = &item->inputs;
    bVar6 = false;
  }
  if (this_01->expected_min_ == 0) {
    if ((ulong)((long)(item->inputs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(item->inputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      peVar1 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar1->_vptr_Config[2])(&res,peVar1,item);
      if ((this_01->super_OptionBase<CLI::Option>).disable_flag_override_ == true) {
        ::std::__cxx11::string::string((string *)&local_130,(string *)&res);
        iVar11 = detail::to_flag_value(&local_130);
        ::std::__cxx11::string::~string((string *)&local_130);
        if (iVar11 != 1) goto LAB_0013e03a;
        ::std::__cxx11::string::string((string *)&local_1f0,"{}",&local_2a9);
        Option::get_flag_value(&local_250,this_01,psVar13,&local_1f0);
        ::std::__cxx11::string::operator=((string *)&res,(string *)&local_250);
        ::std::__cxx11::string::~string((string *)&local_250);
        psVar13 = &local_1f0;
LAB_0013e0ac:
        ::std::__cxx11::string::~string((string *)psVar13);
      }
      else {
LAB_0013e03a:
        piVar12 = __errno_location();
        *piVar12 = 0;
        bVar6 = ::std::operator!=(&res,"{}");
        if ((bVar6) || (this_01->expected_max_ < 2)) {
          ::std::__cxx11::string::string((string *)&local_210,(string *)&res);
          Option::get_flag_value(&local_250,this_01,psVar13,&local_210);
          ::std::__cxx11::string::operator=((string *)&res,(string *)&local_250);
          ::std::__cxx11::string::~string((string *)&local_250);
          psVar13 = &local_210;
          goto LAB_0013e0ac;
        }
      }
      ::std::__cxx11::string::string((string *)&local_230,(string *)&res);
      Option::add_result(this_01,&local_230);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::__cxx11::string::~string((string *)&res);
      goto LAB_0013de4f;
    }
    pvVar5 = &buffer;
    if (!bVar6) {
      pvVar5 = &item->inputs;
    }
    ppbVar4 = &(pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    pbVar14 = *ppbVar4;
    pbVar2 = (local_2b8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar8 = Option::get_items_expected_max(this_01);
    if ((iVar8 < (int)((ulong)((long)pbVar14 - (long)pbVar2) >> 5)) &&
       ((this_01->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeAll)) {
      iVar8 = Option::get_items_expected_max(this_01);
      if (1 < iVar8) {
        __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_190,item);
        iVar8 = Option::get_items_expected_max(this_01);
        ArgumentMismatch::AtMost
                  (__return_storage_ptr___00,&local_190,iVar8,
                   (long)*ppbVar4 -
                   (long)(local_2b8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      if ((this_01->super_OptionBase<CLI::Option>).disable_flag_override_ == false) {
        __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_1b0,item);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_1b0);
        __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,Error::~Error);
      }
      pbVar2 = *ppbVar4;
      for (pbVar14 = (local_2b8->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar2;
          pbVar14 = pbVar14 + 1) {
        ppVar15 = (this_01->default_flag_values_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = (this_01->default_flag_values_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar15 == ppVar3) {
          bVar6 = ::std::operator==(pbVar14,"true");
          if ((((!bVar6) && (bVar6 = ::std::operator==(pbVar14,"false"), !bVar6)) &&
              (bVar6 = ::std::operator==(pbVar14,"1"), !bVar6)) &&
             (bVar6 = ::std::operator==(pbVar14,"0"), !bVar6)) {
LAB_0013e0ef:
            this_02 = (InvalidError *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string
                      ((string *)&local_1d0,"invalid flag argument given",(allocator *)&res);
            InvalidError::InvalidError(this_02,&local_1d0);
            __cxa_throw(this_02,&InvalidError::typeinfo,Error::~Error);
          }
        }
        else {
          do {
            if (ppVar15 == ppVar3) goto LAB_0013e0ef;
            _Var7 = ::std::operator==(&ppVar15->second,pbVar14);
            ppVar15 = ppVar15 + 1;
          } while (!_Var7);
        }
        ::std::__cxx11::string::string((string *)&local_150,(string *)pbVar14);
        Option::add_result(this_01,&local_150);
        ::std::__cxx11::string::~string((string *)&local_150);
      }
      goto LAB_0013de4f;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,local_2b8);
  Option::add_result(this_01,&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  Option::run_callback(this_01);
LAB_0013de4f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&buffer);
  return true;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }
    if(op->empty()) {
        std::vector<std::string> buffer;  // a buffer to use for copying an modifying inputs in a few cases
        bool useBuffer{false};
        if(item.multiline) {
            if(!op->get_inject_separator()) {
                buffer = item.inputs;
                buffer.erase(std::remove(buffer.begin(), buffer.end(), "%%"), buffer.end());
                useBuffer = true;
            }
        }
        const std::vector<std::string> &inputs = (useBuffer) ? buffer : item.inputs;
        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(inputs);
        op->run_callback();
    }

    return true;
}